

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcolumn_bmod.c
# Opt level: O1

int zcolumn_bmod(int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int_t *piVar11;
  uint uVar12;
  int_t iVar13;
  int iVar14;
  long lVar15;
  uint ldm;
  int iVar16;
  ulong uVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int_t next;
  ulong uVar23;
  int iVar24;
  void *pvVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  int_t *piVar29;
  int_t *piVar30;
  uint nrow;
  doublecomplex *pdVar31;
  int iVar32;
  doublecomplex *Mxvec;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  int_t nzlumax;
  doublecomplex zero;
  void *local_e8;
  int_t local_dc;
  doublecomplex *local_d8;
  int_t *local_d0;
  ulong local_c8;
  int local_bc;
  uint local_b8;
  uint local_b4;
  int_t *local_b0;
  int_t *local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  flops_t *local_88;
  int *local_80;
  long local_78;
  long local_70;
  long local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  double local_48;
  double dStack_40;
  
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_88 = stat->ops;
  local_80 = Glu->xsup;
  local_58 = Glu->supno;
  piVar29 = Glu->lsub;
  local_a8 = Glu->xlsub;
  local_e8 = Glu->lusup;
  piVar30 = Glu->xlusup;
  local_dc = Glu->nzlumax;
  local_90 = (long)jcol;
  local_78 = (long)local_58[local_90];
  local_d8 = tempv;
  local_d0 = piVar30;
  local_bc = jcol;
  local_b4 = nseg;
  local_60 = repfnz;
  local_50 = segrep;
  if (0 < nseg) {
    uVar17 = (ulong)(uint)nseg;
    local_70 = (long)local_e8 + 8;
    uVar23 = 0;
    local_b0 = piVar29;
    do {
      piVar11 = local_b0;
      iVar22 = local_50[uVar17 - 1];
      local_a0 = uVar23;
      local_98 = uVar17;
      if ((int)local_78 != local_58[iVar22]) {
        iVar21 = local_80[local_58[iVar22]];
        iVar24 = fpanelc;
        if (fpanelc < iVar21) {
          iVar24 = iVar21;
        }
        iVar28 = iVar24 - iVar21;
        iVar32 = piVar30[iVar24] + iVar28;
        iVar16 = local_a8[iVar21] + iVar28;
        iVar14 = local_60[iVar22];
        if (local_60[iVar22] <= fpanelc) {
          iVar14 = fpanelc;
        }
        uVar12 = (iVar22 - iVar14) + 1;
        uVar27 = iVar22 - iVar24;
        iVar10 = local_a8[(long)iVar21 + 1];
        lVar15 = (long)iVar10;
        ldm = iVar10 - local_a8[iVar21];
        local_c8 = (ulong)ldm;
        nrow = (~uVar27 - iVar28) + ldm;
        iVar28 = uVar27 + iVar16;
        local_88[0x13] = (float)(int)((iVar22 - iVar14) * uVar12 * 4) + local_88[0x13];
        iVar21 = uVar27 + iVar16 + 1;
        local_88[0x14] = (float)(int)(nrow * uVar12 * 8) + local_88[0x14];
        piVar29 = local_b0;
        piVar30 = local_d0;
        local_b8 = uVar12;
        if (iVar22 == iVar14) {
          if (iVar21 < iVar10) {
            dVar35 = dense[local_b0[iVar28]].r;
            dVar36 = dense[local_b0[iVar28]].i;
            lVar20 = (long)iVar21;
            pdVar18 = (double *)((long)(int)(ldm * uVar27 + iVar32 + uVar27 + 1) * 0x10 + local_70);
            do {
              iVar22 = local_b0[lVar20];
              dVar33 = pdVar18[-1];
              dVar1 = *pdVar18;
              dVar34 = dense[iVar22].i;
              dense[iVar22].r = dense[iVar22].r - (dVar35 * dVar33 + dVar1 * -dVar36);
              dense[iVar22].i = dVar34 - (dVar33 * dVar36 + dVar1 * dVar35);
              lVar20 = lVar20 + 1;
              pdVar18 = pdVar18 + 2;
            } while (lVar20 < lVar15);
          }
        }
        else if (iVar22 - iVar14 < 3) {
          iVar22 = local_b0[iVar28];
          pdVar31 = dense + iVar22;
          iVar32 = (ldm + 1) * uVar27 + iVar32;
          iVar24 = local_b0[(long)iVar28 + -1];
          dVar35 = dense[iVar24].r;
          dVar36 = dense[iVar24].i;
          iVar16 = iVar32 - ldm;
          if (uVar12 == 2) {
            lVar20 = (long)iVar16 * 0x10;
            dVar33 = *(double *)((long)local_e8 + lVar20 + 8);
            dVar1 = dense[iVar22].r -
                    (dVar35 * *(double *)((long)local_e8 + lVar20) - dVar33 * dVar36);
            dVar33 = dense[iVar22].i -
                     (*(double *)((long)local_e8 + lVar20) * dVar36 + dVar33 * dVar35);
            pdVar31->r = dVar1;
            pdVar31->i = dVar33;
            if (iVar21 < iVar10) {
              lVar19 = (long)iVar21;
              pvVar25 = local_e8;
              do {
                iVar22 = local_b0[lVar19];
                dVar34 = *(double *)((long)pvVar25 + (long)iVar32 * 0x10 + 0x10);
                dVar2 = *(double *)((long)pvVar25 + (long)iVar32 * 0x10 + 0x18);
                dVar3 = *(double *)((long)pvVar25 + lVar20 + 0x10);
                dVar4 = *(double *)((long)pvVar25 + lVar20 + 0x18);
                dVar5 = dense[iVar22].i;
                dense[iVar22].r =
                     dense[iVar22].r -
                     (dVar35 * dVar3 + dVar4 * -dVar36 + dVar1 * dVar34 + dVar2 * -dVar33);
                dense[iVar22].i =
                     dVar5 - (dVar3 * dVar36 + dVar4 * dVar35 + dVar34 * dVar33 + dVar2 * dVar1);
                lVar19 = lVar19 + 1;
                pvVar25 = (void *)((long)pvVar25 + 0x10);
              } while (lVar19 < lVar15);
            }
          }
          else {
            dVar33 = dense[local_b0[(long)iVar28 + -2]].r;
            dVar1 = dense[local_b0[(long)iVar28 + -2]].i;
            lVar19 = (long)(int)(iVar16 - ldm) * 0x10;
            dVar34 = *(double *)((long)local_e8 + lVar19 + -0x10);
            dVar2 = *(double *)((long)local_e8 + lVar19 + -8);
            dVar35 = dVar35 - (dVar33 * dVar34 - dVar2 * dVar1);
            dVar36 = dVar36 - (dVar34 * dVar1 + dVar2 * dVar33);
            lVar20 = (long)iVar16 * 0x10;
            dVar34 = *(double *)((long)local_e8 + lVar20 + 8);
            dVar2 = *(double *)((long)local_e8 + lVar19 + 8);
            dVar3 = dense[iVar22].r -
                    ((dVar33 * *(double *)((long)local_e8 + lVar19) - dVar2 * dVar1) +
                    (dVar35 * *(double *)((long)local_e8 + lVar20) - dVar34 * dVar36));
            dVar34 = dense[iVar22].i -
                     (*(double *)((long)local_e8 + lVar19) * dVar1 + dVar2 * dVar33 +
                     *(double *)((long)local_e8 + lVar20) * dVar36 + dVar34 * dVar35);
            pdVar31->r = dVar3;
            pdVar31->i = dVar34;
            dense[iVar24].r = dVar35;
            dense[iVar24].i = dVar36;
            if (iVar21 < iVar10) {
              lVar19 = (long)iVar21;
              lVar26 = (long)(int)ldm * -0x10 + lVar20;
              pvVar25 = local_e8;
              do {
                iVar22 = local_b0[lVar19];
                dVar2 = *(double *)((long)pvVar25 + (long)iVar32 * 0x10 + 0x10);
                dVar4 = *(double *)((long)pvVar25 + (long)iVar32 * 0x10 + 0x18);
                dVar5 = *(double *)((long)pvVar25 + lVar20 + 0x10);
                dVar6 = *(double *)((long)pvVar25 + lVar20 + 0x18);
                dVar7 = *(double *)((long)pvVar25 + lVar26 + 0x10);
                dVar8 = *(double *)((long)pvVar25 + lVar26 + 0x18);
                dVar9 = dense[iVar22].i;
                dense[iVar22].r =
                     dense[iVar22].r -
                     (dVar33 * dVar7 + dVar8 * -dVar1 +
                     dVar35 * dVar5 + dVar6 * -dVar36 + dVar3 * dVar2 + dVar4 * -dVar34);
                dense[iVar22].i =
                     dVar9 - (dVar7 * dVar1 + dVar8 * dVar33 +
                             dVar5 * dVar36 + dVar6 * dVar35 + dVar2 * dVar34 + dVar4 * dVar3);
                lVar19 = lVar19 + 1;
                pvVar25 = (void *)((long)pvVar25 + 0x10);
              } while (lVar19 < lVar15);
            }
          }
        }
        else {
          iVar16 = iVar16 + (iVar14 - iVar24);
          uVar17 = (ulong)((iVar22 - iVar14) + 1);
          lVar15 = 0;
          uVar23 = uVar17;
          do {
            dVar35 = dense[*(int *)((long)local_b0 + lVar15 + (long)iVar16 * 4)].i;
            pdVar18 = (double *)((long)&local_d8->r + lVar15 * 4);
            *pdVar18 = dense[*(int *)((long)local_b0 + lVar15 + (long)iVar16 * 4)].r;
            pdVar18[1] = dVar35;
            lVar15 = lVar15 + 4;
            uVar23 = uVar23 - 1;
          } while (uVar23 != 0);
          local_68 = (long)(int)((ldm + 1) * (iVar14 - iVar24) + iVar32);
          zlsolve(ldm,uVar12,(doublecomplex *)(local_68 * 0x10 + (long)local_e8),local_d8);
          Mxvec = local_d8 + uVar12;
          zmatvec((int)local_c8,nrow,uVar12,
                  (doublecomplex *)((long)(int)((int)local_68 + uVar12) * 0x10 + (long)local_e8),
                  local_d8,Mxvec);
          uVar23 = 0;
          pdVar31 = local_d8;
          iVar22 = iVar16;
          do {
            iVar21 = piVar11[(long)iVar16 + uVar23];
            dVar35 = pdVar31->i;
            dense[iVar21].r = pdVar31->r;
            dense[iVar21].i = dVar35;
            pdVar31->r = 0.0;
            pdVar31->i = 0.0;
            uVar23 = uVar23 + 1;
            pdVar31 = pdVar31 + 1;
            iVar22 = iVar22 + 1;
          } while (uVar17 != uVar23);
          piVar29 = local_b0;
          piVar30 = local_d0;
          if (0 < (int)nrow) {
            uVar23 = 0;
            do {
              iVar21 = local_b0[(long)iVar22 + uVar23];
              dVar35 = dense[iVar21].i;
              dense[iVar21].r = dense[iVar21].r - Mxvec->r;
              dense[iVar21].i = dVar35 - Mxvec->i;
              Mxvec->r = 0.0;
              Mxvec->i = 0.0;
              uVar23 = uVar23 + 1;
              Mxvec = Mxvec + 1;
            } while (uVar23 < nrow);
          }
        }
      }
      uVar17 = local_98 - 1;
      uVar12 = (int)local_a0 + 1;
      uVar23 = (ulong)uVar12;
    } while (uVar12 != local_b4);
  }
  next = piVar30[local_90];
  iVar22 = local_80[local_78];
  iVar21 = (local_a8[(long)iVar22 + 1] + next) - local_a8[iVar22];
  if (local_dc < iVar21) {
    do {
      iVar13 = zLUMemXpand(local_bc,next,LUSUP,&local_dc,Glu);
      if (iVar13 != 0) {
        return iVar13;
      }
    } while (local_dc < iVar21);
    piVar29 = Glu->lsub;
    local_e8 = Glu->lusup;
    piVar30 = local_d0;
  }
  lVar15 = (long)local_a8[iVar22];
  if (local_a8[iVar22] < local_a8[(long)iVar22 + 1]) {
    pdVar18 = (double *)((long)next * 0x10 + (long)local_e8);
    do {
      iVar21 = piVar29[lVar15];
      dVar35 = dense[iVar21].i;
      *pdVar18 = dense[iVar21].r;
      pdVar18[1] = dVar35;
      dense[iVar21].r = local_48;
      dense[iVar21].i = dStack_40;
      lVar15 = lVar15 + 1;
      pdVar18 = pdVar18 + 2;
      next = next + 1;
    } while (lVar15 < local_a8[(long)iVar22 + 1]);
  }
  if (fpanelc < iVar22) {
    fpanelc = iVar22;
  }
  piVar30[local_90 + 1] = next;
  iVar21 = local_bc - fpanelc;
  if (iVar21 != 0 && fpanelc <= local_bc) {
    iVar24 = piVar30[fpanelc];
    iVar14 = local_a8[(long)iVar22 + 1] - local_a8[iVar22];
    uVar12 = (iVar22 - local_bc) + iVar14;
    local_a0 = CONCAT44(local_a0._4_4_,iVar14);
    iVar16 = piVar30[local_90];
    local_88[0x13] = (float)((iVar21 + -1) * iVar21 * 4) + local_88[0x13];
    local_98 = (long)iVar24 + (long)(fpanelc - iVar22);
    lVar15 = (long)iVar16 + (long)(fpanelc - iVar22);
    local_88[0x14] = (float)(int)(iVar21 * uVar12 * 8) + local_88[0x14];
    pdVar31 = (doublecomplex *)(lVar15 * 0x10 + (long)local_e8);
    zlsolve(iVar14,iVar21,(doublecomplex *)(local_98 * 0x10 + (long)local_e8),pdVar31);
    zmatvec((int)local_a0,uVar12,iVar21,
            (doublecomplex *)((long)((int)local_98 + iVar21) * 0x10 + (long)local_e8),pdVar31,
            local_d8);
    if (0 < (int)uVar12) {
      iVar21 = (int)lVar15 + iVar21;
      lVar15 = (long)iVar21 * 0x10 + 8;
      lVar20 = 0;
      uVar23 = 0;
      do {
        dVar35 = *(double *)((long)local_e8 + lVar20 + lVar15);
        *(double *)((long)local_e8 + lVar20 + (long)iVar21 * 0x10) =
             *(double *)((long)local_e8 + lVar20 + (long)iVar21 * 0x10) -
             *(double *)((long)&local_d8->r + lVar20);
        *(double *)((long)local_e8 + lVar20 + lVar15) =
             dVar35 - *(double *)((long)&local_d8->i + lVar20);
        pdVar18 = (double *)((long)&local_d8->r + lVar20);
        *pdVar18 = local_48;
        pdVar18[1] = dStack_40;
        uVar23 = uVar23 + 1;
        lVar20 = lVar20 + 0x10;
      } while (uVar23 < uVar12);
    }
  }
  return 0;
}

Assistant:

int
zcolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     doublecomplex     *dense,	  /* in */
	     doublecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    doublecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    doublecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    doublecomplex       *tempv1;
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      none = {-1.0, 0.0};
    doublecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += 4 * segsze * (segsze - 1);
	    ops[GEMV] += 8 * nrow * segsze;



	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		    z_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    z_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    z_sub(&ukj1, &ukj1, &comp_temp);

		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    z_add(&comp_temp, &comp_temp, &comp_temp1);
		    z_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		zlsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		zmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    z_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (doublecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ztrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	zgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	zlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	zmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    z_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}